

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void * vrna_realloc(void *p,uint size)

{
  int iVar1;
  void *pvVar2;
  int *piVar3;
  char *__arg;
  char *pcVar4;
  
  pcVar4 = (char *)(ulong)size;
  if (p == (void *)0x0) {
    pvVar2 = vrna_alloc(size);
    return pvVar2;
  }
  __arg = pcVar4;
  pvVar2 = realloc(p,(size_t)pcVar4);
  if (pvVar2 != (void *)0x0) {
    return pvVar2;
  }
  piVar3 = __errno_location();
  if (*piVar3 == 0xc) {
    pcVar4 = "vrna_realloc allocation failure -> no memory";
  }
  else {
    if (*piVar3 != 0x16) {
      return (void *)0x0;
    }
    __arg = "vrna_realloc: requested size: %d\n";
    fprintf(_stderr,"vrna_realloc: requested size: %d\n",pcVar4);
    pcVar4 = "vrna_realloc allocation failure -> EINVAL";
  }
  vrna_message_error(pcVar4);
  iVar1 = fileno(_stderr);
  iVar1 = isatty(iVar1);
  if (iVar1 == 0) {
    fwrite("ERROR: ",7,1,_stderr);
    vfprintf(_stderr,pcVar4,__arg);
    fputc(10,_stderr);
  }
  else {
    fwrite("\x1b[1;31mERROR: \x1b[0m\x1b[1m",0x16,1,_stderr);
    vfprintf(_stderr,pcVar4,__arg);
    fwrite("\x1b[0m\n",5,1,_stderr);
  }
  exit(1);
}

Assistant:

PUBLIC void *
vrna_realloc(void     *p,
             unsigned size)
{
  if (p == NULL)
    return vrna_alloc(size);

  p = (void *)realloc(p, size);
  if (p == NULL) {
#ifdef EINVAL
    if (errno == EINVAL) {
      fprintf(stderr, "vrna_realloc: requested size: %d\n", size);
      vrna_message_error("vrna_realloc allocation failure -> EINVAL");
    }

    if (errno == ENOMEM)
#endif
    vrna_message_error("vrna_realloc allocation failure -> no memory");
  }

  return p;
}